

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaFoodWeb_bnd.c
# Opt level: O3

void PrintFinalStats(void *mem)

{
  uint uVar1;
  long ncfn;
  long netf;
  long nje;
  long nnf;
  long nni;
  long nreLS;
  long nre;
  long nst;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  
  uVar1 = IDAGetNumSteps(mem,&local_10);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumSteps",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumNonlinSolvIters(mem,&local_28);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumNonlinSolvIters",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumResEvals(mem,&local_18);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumResEvals",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumErrTestFails(mem,&local_40);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumErrTestFails",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumNonlinSolvConvFails(mem,&local_30);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            "IDAGetNumNonlinSolvConvFails",(ulong)uVar1);
  }
  uVar1 = IDAGetNumStepSolveFails(mem,&local_48);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumStepSolveFails",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumJacEvals(mem,&local_38);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumJacEvals",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumLinResEvals(mem,&local_20);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumLinResEvals",
            (ulong)uVar1);
  }
  puts("-----------------------------------------------------------");
  puts("Final run statistics: \n");
  printf("Number of steps                    = %ld\n",local_10);
  printf("Number of residual evaluations     = %ld\n",local_20 + local_18);
  printf("Number of Jacobian evaluations     = %ld\n",local_38);
  printf("Number of nonlinear iterations     = %ld\n",local_28);
  printf("Number of error test failures      = %ld\n",local_40);
  printf("Number of nonlinear conv. failures = %ld\n",local_30);
  printf("Number of step solver failures     = %ld\n",local_48);
  return;
}

Assistant:

static void PrintFinalStats(void* mem)
{
  long int nst, nre, nreLS, nni, nnf, nje, netf, ncfn;
  int retval;

  retval = IDAGetNumSteps(mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetNumNonlinSolvIters(mem, &nni);
  check_retval(&retval, "IDAGetNumNonlinSolvIters", 1);
  retval = IDAGetNumResEvals(mem, &nre);
  check_retval(&retval, "IDAGetNumResEvals", 1);
  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);
  retval = IDAGetNumNonlinSolvConvFails(mem, &nnf);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);
  retval = IDAGetNumStepSolveFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumStepSolveFails", 1);
  retval = IDAGetNumJacEvals(mem, &nje);
  check_retval(&retval, "IDAGetNumJacEvals", 1);
  retval = IDAGetNumLinResEvals(mem, &nreLS);
  check_retval(&retval, "IDAGetNumLinResEvals", 1);

  printf("-----------------------------------------------------------\n");
  printf("Final run statistics: \n\n");
  printf("Number of steps                    = %ld\n", nst);
  printf("Number of residual evaluations     = %ld\n", nre + nreLS);
  printf("Number of Jacobian evaluations     = %ld\n", nje);
  printf("Number of nonlinear iterations     = %ld\n", nni);
  printf("Number of error test failures      = %ld\n", netf);
  printf("Number of nonlinear conv. failures = %ld\n", nnf);
  printf("Number of step solver failures     = %ld\n", ncfn);
}